

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

string * __thiscall
Character::GuildRankString_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  element_type *peVar3;
  bool bVar4;
  mapped_type *this_00;
  uint uVar5;
  size_type sVar6;
  pointer pcVar7;
  key_type local_48;
  
  if ((this->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  pWVar2 = this->world;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GuildCustomRanks","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,&local_48);
  bVar4 = util::variant::GetBool(this_00);
  if (bVar4) {
    sVar6 = (this->guild_rank_string)._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (sVar6 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = (this->guild_rank_string)._M_dataplus._M_p;
      sVar6 = (this->guild_rank_string)._M_string_length;
      goto LAB_00119813;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  peVar3 = (this->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = (*(int *)&this->guild_rank + (uint)((char)*(int *)&this->guild_rank == '\0') & 0xff) - 1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar7 = (peVar3->ranks)._M_elems[uVar5]._M_dataplus._M_p;
  sVar6 = (peVar3->ranks)._M_elems[uVar5]._M_string_length;
LAB_00119813:
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar7,pcVar7 + sVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string Character::GuildRankString()
{
	if (!this->guild)
		return "";

	if (this->world->config["GuildCustomRanks"] && !this->guild_rank_string.empty())
	{
		return this->guild_rank_string;
	}
	else
	{
		return this->guild->GetRank(this->guild_rank);
	}
}